

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::dumpCaptureReplayKernelSource(CLIntercept *this,string *dumpDirectory,cl_kernel kernel)

{
  cl_api_clGetProgramInfo p_Var1;
  size_t sVar2;
  _Ios_Openmode _Var3;
  cl_icd_dispatch *pcVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  _cl_device_id **pp_Var8;
  unsigned_long *puVar9;
  char *__rhs;
  uchar **ppuVar10;
  reference this_00;
  cl_kernel in_RDX;
  CLIntercept *in_RDI;
  ofstream output_1;
  size_t device_1;
  size_t device;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> binariesData;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  binaries;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> devices;
  cl_uint num_devices;
  ofstream output;
  int error;
  string sourceCode;
  size_t size;
  cl_program program;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffff970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  _Ios_Openmode in_stack_fffffffffffff984;
  size_type in_stack_fffffffffffff988;
  cl_program p_Var11;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *in_stack_fffffffffffff990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a4;
  undefined4 uVar12;
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  char local_510 [512];
  ulong local_310;
  uchar *local_308;
  size_type local_300;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2c0 [2];
  uint local_284;
  string local_280 [32];
  char local_260 [512];
  cl_int local_60;
  allocator local_49;
  string local_48 [32];
  size_t local_28;
  cl_program local_20;
  cl_kernel local_18;
  
  local_20 = (cl_program)0x0;
  local_18 = in_RDX;
  pcVar4 = dispatch(in_RDI);
  (*pcVar4->clGetKernelInfo)(local_18,0x1194,8,&local_20,(size_t *)0x0);
  local_28 = 0;
  pcVar4 = dispatch(in_RDI);
  (*pcVar4->clGetProgramInfo)(local_20,0x1164,0,(void *)0x0,&local_28);
  sVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,sVar2,' ',&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar4 = dispatch(in_RDI);
  p_Var11 = local_20;
  sVar2 = local_28;
  p_Var1 = pcVar4->clGetProgramInfo;
  pvVar5 = (void *)std::__cxx11::string::operator[]((ulong)local_48);
  local_60 = (*p_Var1)(p_Var11,0x1164,sVar2,pvVar5,(size_t *)0x0);
  if ((local_60 == 0) && (1 < local_28)) {
    std::operator+(in_stack_fffffffffffff998,(char *)in_stack_fffffffffffff990);
    _Var3 = std::operator|(_S_out,_S_bin);
    std::ofstream::ofstream(local_260,local_280,_Var3);
    std::__cxx11::string::~string(local_280);
    lVar6 = std::__cxx11::string::c_str();
    std::ostream::write(local_260,lVar6);
    std::ofstream::~ofstream(local_260);
  }
  else {
    local_284 = 0;
    pcVar4 = dispatch(in_RDI);
    (*pcVar4->clGetProgramInfo)(local_20,0x1162,4,&local_284,(size_t *)0x0);
    std::allocator<_cl_device_id_*>::allocator((allocator<_cl_device_id_*> *)0x20c3ce);
    std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::vector
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
    std::allocator<_cl_device_id_*>::~allocator((allocator<_cl_device_id_*> *)0x20c3fa);
    pcVar4 = dispatch(in_RDI);
    p_Var11 = local_20;
    p_Var1 = pcVar4->clGetProgramInfo;
    uVar7 = (ulong)local_284;
    pp_Var8 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::data
                        ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)0x20c458);
    (*p_Var1)(p_Var11,0x1163,uVar7 << 3,pp_Var8,(size_t *)0x0);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x20c49f);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff990,
               in_stack_fffffffffffff988,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x20c4c5);
    pcVar4 = dispatch(in_RDI);
    p_Var11 = local_20;
    p_Var1 = pcVar4->clGetProgramInfo;
    uVar7 = (ulong)local_284;
    puVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x20c514);
    (*p_Var1)(p_Var11,0x1165,uVar7 << 3,puVar9,(size_t *)0x0);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)0x20c546);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x20c553);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::reserve((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
              (size_type)in_stack_fffffffffffff998);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::reserve
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
               CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
               (size_type)in_stack_fffffffffffff998);
    for (local_300 = 0; local_300 != local_284; local_300 = local_300 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_2c0,local_300);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<unsigned_long&>
                ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                 (unsigned_long *)in_stack_fffffffffffff978);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[](&local_2e0,local_300);
      local_308 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x20c5e8);
      std::vector<unsigned_char*,std::allocator<unsigned_char*>>::emplace_back<unsigned_char*>
                ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                 CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                 (uchar **)in_stack_fffffffffffff978);
    }
    pcVar4 = dispatch(in_RDI);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            pcVar4->clGetProgramInfo;
    __rhs = (char *)((ulong)local_284 << 3);
    p_Var11 = local_20;
    ppuVar10 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::data
                         ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x20c708);
    local_60 = (*(code *)__lhs)(p_Var11,0x1166,__rhs,ppuVar10,0);
    if (local_60 == 0) {
      uVar12 = 0;
      for (local_310 = 0; local_310 != local_284; local_310 = local_310 + 1) {
        std::operator+(__lhs,__rhs);
        std::__cxx11::to_string((unsigned_long)pcVar4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar12,in_stack_fffffffffffff9a0));
        std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
        in_stack_fffffffffffff984 = std::operator|(_S_out,_S_bin);
        std::ofstream::ofstream(local_510,local_530,in_stack_fffffffffffff984);
        std::__cxx11::string::~string(local_530);
        std::__cxx11::string::~string(local_550);
        std::__cxx11::string::~string(local_590);
        std::__cxx11::string::~string(local_570);
        in_stack_fffffffffffff970 = &local_2e0;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](in_stack_fffffffffffff970,local_310);
        in_stack_fffffffffffff978 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x20c861);
        this_00 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator[](in_stack_fffffffffffff970,local_310);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
        std::ostream::write(local_510,(long)in_stack_fffffffffffff978);
        std::ofstream::~ofstream(local_510);
      }
    }
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
               CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
    std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::~vector
              ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
               CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void CLIntercept::dumpCaptureReplayKernelSource(
    const std::string& dumpDirectory,
    cl_kernel kernel )
{
    cl_program program = nullptr;
    dispatch().clGetKernelInfo(kernel, CL_KERNEL_PROGRAM, sizeof(cl_program), &program, nullptr);

    size_t size = 0;
    dispatch().clGetProgramInfo(program, CL_PROGRAM_SOURCE, 0, nullptr, &size);

    std::string sourceCode(size, ' ');
    int error = dispatch().clGetProgramInfo(program, CL_PROGRAM_SOURCE, size, &sourceCode[0], nullptr);
    if( error == CL_SUCCESS && size > 1 )
    {
        std::ofstream output(dumpDirectory + "kernel.cl", std::ios::out | std::ios::binary);
        output.write(sourceCode.c_str(), size);
    }
    else
    {
        cl_uint num_devices = 0;
        dispatch().clGetProgramInfo(program, CL_PROGRAM_NUM_DEVICES, sizeof(cl_uint), &num_devices, nullptr);

        std::vector<cl_device_id> devices(num_devices);
        dispatch().clGetProgramInfo(program, CL_PROGRAM_DEVICES, num_devices * sizeof(cl_device_id), devices.data(), 0);

        std::vector<size_t> sizes(num_devices);
        dispatch().clGetProgramInfo(program, CL_PROGRAM_BINARY_SIZES, num_devices * sizeof(size_t), sizes.data(), nullptr);

        std::vector<std::vector<unsigned char>> binaries;
        std::vector<unsigned char*> binariesData;
        binaries.reserve(num_devices);
        binariesData.reserve(num_devices);
        for( size_t device = 0; device != num_devices; ++device )
        {
            binaries.emplace_back(sizes[device]);
            binariesData.emplace_back(binaries[device].data());
        }

        error = dispatch().clGetProgramInfo(program, CL_PROGRAM_BINARIES, num_devices * sizeof(unsigned char*), binariesData.data(), nullptr);
        if( error == CL_SUCCESS )
        {
            for (size_t device = 0; device != num_devices; ++device)
            {
                std::ofstream output(dumpDirectory + "DeviceBinary" + std::to_string(device) + ".bin", std::ios::out | std::ios::binary);
                output.write(reinterpret_cast<char const*>(binaries[device].data()), binaries[device].size());
            }
        }
    }
}